

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey_test.c
# Opt level: O2

void test_surv_ctx_recv_close_socket(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_msg *local_50;
  nng_msg *m;
  nng_ctx local_40;
  nng_socket resp;
  nng_ctx ctx;
  nng_socket surv;
  nng_aio *aio;
  
  nVar1 = nng_surveyor0_open(&resp);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1f2,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                         pcVar3,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_respondent0_open((nng_socket *)((long)&m + 4));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                           ,499,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_ctx_open(&local_40,resp);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                             ,500,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx, surv)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_aio_alloc((nng_aio **)&ctx,(_func_void_void_ptr *)0x0,(void *)0x0);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                               ,0x1f5,"%s: expected success, got %s (%d)",
                               "nng_aio_alloc(&aio, NULL, NULL)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nuts_marry(resp,m._4_4_);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                 ,0x1f6,"%s: expected success, got %s (%d)","nuts_marry(surv, resp)"
                                 ,pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_msg_alloc(&local_50,0);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                   ,0x1f7,"%s: expected success, got %s (%d)","nng_msg_alloc(&m, 0)"
                                   ,pcVar3,nVar1);
            if (iVar2 != 0) {
              nng_aio_set_msg(_ctx,local_50);
              nng_ctx_send(local_40,_ctx);
              nng_aio_wait(_ctx);
              nVar1 = nng_aio_result(_ctx);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                     ,0x1fb,"%s: expected success, got %s (%d)",
                                     "nng_aio_result(aio)",pcVar3,nVar1);
              if (iVar2 != 0) {
                nng_ctx_recv(local_40,_ctx);
                nng_socket_close(resp);
                nng_aio_wait(_ctx);
                nVar1 = nng_aio_result(_ctx);
                pcVar3 = nng_strerror(NNG_ECLOSED);
                acutest_check_((uint)(nVar1 == NNG_ECLOSED),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                               ,0x201,"%s fails with %s","nng_aio_result(aio)",pcVar3);
                pcVar3 = nng_strerror(NNG_ECLOSED);
                pcVar4 = nng_strerror(nVar1);
                acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,7,
                                 pcVar4,(ulong)nVar1);
                nng_aio_free(_ctx);
                nVar1 = nng_socket_close(m._4_4_);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                       ,0x203,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(resp)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_surv_ctx_recv_close_socket(void)
{
	nng_socket surv;
	nng_socket resp;
	nng_ctx    ctx;
	nng_aio   *aio;
	nng_msg   *m;

	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_ctx_open(&ctx, surv));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	NUTS_MARRY(surv, resp);
	NUTS_PASS(nng_msg_alloc(&m, 0));
	nng_aio_set_msg(aio, m);
	nng_ctx_send(ctx, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));

	nng_ctx_recv(ctx, aio);
	nng_socket_close(surv);

	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ECLOSED);
	nng_aio_free(aio);
	NUTS_CLOSE(resp);
}